

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

Orphan<capnp::DynamicList> * __thiscall
capnp::JsonCodec::decodeArray
          (Orphan<capnp::DynamicList> *__return_storage_ptr__,JsonCodec *this,Reader input,
          ListSchema type,Orphanage orphanage)

{
  Reader input_00;
  Orphanage orphanage_00;
  ulong uVar1;
  ulong uVar2;
  Builder output;
  Orphanage local_e0;
  Orphan<capnp::DynamicValue> local_d0;
  StructReader local_98;
  Builder local_68;
  
  local_e0.capTable = orphanage.capTable;
  local_e0.arena = orphanage.arena;
  Orphanage::newOrphan(__return_storage_ptr__,&local_e0,type,input.reader.elementCount);
  Orphan<capnp::DynamicList>::get(&local_68,__return_storage_ptr__);
  uVar2 = (ulong)input.reader.elementCount;
  if (uVar2 != 0) {
    uVar1 = 0;
    do {
      capnp::_::ListReader::getStructElement(&local_98,&input.reader,(ElementCount)uVar1);
      orphanage_00.capTable = local_e0.capTable;
      orphanage_00.arena = local_e0.arena;
      input_00._reader.capTable = local_98.capTable;
      input_00._reader.segment = local_98.segment;
      input_00._reader.data = local_98.data;
      input_00._reader.pointers = local_98.pointers;
      input_00._reader.dataSize = local_98.dataSize;
      input_00._reader.pointerCount = local_98.pointerCount;
      input_00._reader._38_2_ = local_98._38_2_;
      input_00._reader.nestingLimit = local_98.nestingLimit;
      input_00._reader._44_4_ = local_98._44_4_;
      decode(&local_d0,this,input_00,type.elementType,orphanage_00);
      DynamicList::Builder::adopt(&local_68,(ElementCount)uVar1,&local_d0);
      if (local_d0.builder.segment != (SegmentBuilder *)0x0) {
        capnp::_::OrphanBuilder::euthanize(&local_d0.builder);
      }
      uVar1 = uVar1 + 1;
    } while (uVar2 != uVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicList> JsonCodec::decodeArray(List<JsonValue>::Reader input, ListSchema type, Orphanage orphanage) const {
  auto orphan = orphanage.newOrphan(type, input.size());
  auto output = orphan.get();
  for (auto i: kj::indices(input)) {
    output.adopt(i, decode(input[i], type.getElementType(), orphanage));
  }
  return orphan;
}